

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall
Fl_Text_Buffer::search_backward
          (Fl_Text_Buffer *this,int startPos,char *searchString,int *foundPos,int matchCase)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint ucs;
  uint ucs_00;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  int l;
  wchar_t local_3c;
  int *local_38;
  
  iVar5 = 0;
  if (searchString != (char *)0x0) {
    local_38 = foundPos;
    iVar5 = startPos;
    if (matchCase == 0) {
      if (startPos < 0) {
        return 0;
      }
      cVar1 = *searchString;
      while (pcVar8 = searchString, iVar2 = iVar5, cVar1 != '\0') {
        while( true ) {
          ucs = char_at(this,iVar2);
          ucs_00 = fl_utf8decode(pcVar8,(char *)0x0,&local_3c);
          iVar3 = fl_tolower(ucs);
          iVar4 = fl_tolower(ucs_00);
          if (iVar3 != iVar4) break;
          lVar6 = (long)local_3c;
          iVar2 = next_char(this,iVar2);
          pcVar7 = pcVar8 + lVar6;
          pcVar8 = pcVar8 + lVar6;
          if (*pcVar7 == '\0') goto LAB_001d0415;
        }
        if (iVar5 == 0) {
          return 0;
        }
        iVar5 = prev_char_clipped(this,iVar5);
        cVar1 = *searchString;
      }
    }
    else {
      pcVar8 = searchString;
      if (startPos < 0) {
        return 0;
      }
      while (*pcVar8 != '\0') {
        iVar2 = fl_utf8len1(*pcVar8);
        pcVar7 = this->mBuf + startPos + ((long)this->mGapEnd - (long)this->mGapStart);
        if (startPos < this->mGapStart) {
          pcVar7 = this->mBuf + startPos;
        }
        iVar3 = bcmp(pcVar8,pcVar7,(long)iVar2);
        startPos = iVar2 + startPos;
        pcVar8 = pcVar8 + iVar2;
        if (iVar3 != 0) {
          if (iVar5 == 0) {
            return 0;
          }
          startPos = prev_char_clipped(this,iVar5);
          pcVar8 = searchString;
          iVar5 = startPos;
        }
      }
    }
LAB_001d0415:
    *local_38 = iVar5;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Fl_Text_Buffer::search_backward(int startPos, const char *searchString,
				    int *foundPos, int matchCase) const 
{
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED(searchString)
  
  if (!searchString)
    return 0;
  int bp;
  const char *sp;
  if (matchCase) {
    while (startPos >= 0) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        char c = *sp;
        // we reached the end of the "needle", so we found the string!
        if (!c) {
          *foundPos = startPos;
          return 1;
        }
        int l = fl_utf8len1(c);
        if (memcmp(sp, address(bp), l))
          break;
        sp += l; bp += l;
      }
      startPos = prev_char(startPos);
    }
  } else {
    while (startPos >= 0) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        // we reached the end of the "needle", so we found the string!
        if (!*sp) {
          *foundPos = startPos;
          return 1;
        }
        int l;
        unsigned int b = char_at(bp);
        unsigned int s = fl_utf8decode(sp, 0, &l);
        if (fl_tolower(b)!=fl_tolower(s))
          break;
        sp += l; 
        bp = next_char(bp);
      }
      startPos = prev_char(startPos);
    }
  }  
  return 0;
}